

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

void __thiscall
OpenMD::EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint
          (EqualIgnoreCaseConstraint *this,string *rhs)

{
  ostream *poVar1;
  locale *in_RCX;
  stringstream iss;
  string asStack_1c8 [32];
  undefined1 local_1a8 [392];
  
  (this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_._M_dataplus.
  _M_p = (pointer)&(this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).
                   description_.field_2;
  (this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_.
  _M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_.field_2.
  _M_local_buf[0] = '\0';
  std::locale::locale((locale *)local_1a8);
  toUpperCopy<std::__cxx11::string>
            (&this->rhs_,(OpenMD *)rhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,in_RCX);
  std::locale::~locale((locale *)local_1a8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  poVar1 = std::operator<<((ostream *)(local_1a8 + 0x10),"equal to (case insensitive) ");
  std::operator<<(poVar1,(string *)rhs);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,asStack_1c8);
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  return;
}

Assistant:

EqualIgnoreCaseConstraint(std::string rhs) :
        rhs_(OpenMD::toUpperCopy(rhs)) {
      std::stringstream iss;
      iss << "equal to (case insensitive) " << rhs;
      this->description_ = iss.str();
    }